

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTableDrivenParser.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  ulong uVar1;
  ifstream fin;
  undefined1 auStack_238 [520];
  
  if (argc == 1) {
    parse();
  }
  else if (1 < argc) {
    uVar1 = 1;
    do {
      std::ifstream::ifstream(auStack_238,argv[uVar1],_S_in);
      std::ios::rdbuf((streambuf *)((long)&std::cin + *(long *)(std::cin + -0x18)));
      parse();
      std::ifstream::close();
      std::ios::rdbuf((streambuf *)((long)&std::cin + *(long *)(std::cin + -0x18)));
      std::ifstream::~ifstream(auStack_238);
      uVar1 = uVar1 + 1;
    } while ((uint)argc != uVar1);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    if (argc == 1)
        parse();
    else
        for (int i = 1; i < argc; i++)
        {
            std::ifstream fin(argv[i]);
            auto cinBuf = std::cin.rdbuf(fin.rdbuf());
            parse();
            fin.close();
            std::cin.rdbuf(cinBuf);
        }
}